

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O3

bool __thiscall QSqlQuery::seek(QSqlQuery *this,int index,bool relative)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  QSqlResult *pQVar6;
  
  bVar1 = QSqlResult::isSelect(this->d->sqlResult);
  if (!bVar1) {
    return false;
  }
  bVar1 = QSqlResult::isActive(this->d->sqlResult);
  if (!bVar1) {
    return false;
  }
  if (relative) {
    iVar3 = QSqlResult::at(this->d->sqlResult);
    if (iVar3 == -2) {
      if (-1 < index) {
        return false;
      }
      (*this->d->sqlResult->_vptr_QSqlResult[0x15])();
      iVar3 = QSqlResult::at(this->d->sqlResult);
      index = index + iVar3 + 1;
LAB_001239eb:
      bVar1 = QSqlResult::isForwardOnly(this->d->sqlResult);
      if ((bVar1) && (iVar3 = QSqlResult::at(this->d->sqlResult), index < iVar3)) {
        lcSqlQuery();
        if (((byte)lcSqlQuery::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0
           ) {
          return false;
        }
        seek();
        return false;
      }
      iVar3 = QSqlResult::at(this->d->sqlResult);
      if ((index == iVar3 + 1U) && (iVar3 = QSqlResult::at(this->d->sqlResult), iVar3 != -1)) {
        iVar3 = (*this->d->sqlResult->_vptr_QSqlResult[0x12])();
        cVar2 = (char)iVar3;
      }
      else {
        iVar3 = QSqlResult::at(this->d->sqlResult);
        pQVar6 = this->d->sqlResult;
        pp_Var4 = pQVar6->_vptr_QSqlResult;
        if (index == iVar3 - 1U) {
          iVar3 = (*pp_Var4[0x13])();
          if ((char)iVar3 != '\0') {
            return true;
          }
          goto LAB_00123a8a;
        }
        iVar3 = (*pp_Var4[0x11])(pQVar6,(ulong)(uint)index);
        cVar2 = (char)iVar3;
      }
      if (cVar2 != '\0') {
        return true;
      }
      pQVar6 = this->d->sqlResult;
      pp_Var4 = pQVar6->_vptr_QSqlResult;
      uVar5 = 0xfffffffe;
      goto LAB_00123abb;
    }
    if (iVar3 == -1) {
      if (index < 1) {
        return false;
      }
      index = index - 1;
      goto LAB_001239eb;
    }
    iVar3 = QSqlResult::at(this->d->sqlResult);
    pQVar6 = this->d->sqlResult;
    if (-1 < iVar3 + index) {
      iVar3 = QSqlResult::at(pQVar6);
      index = iVar3 + index;
      goto LAB_001239eb;
    }
  }
  else {
    if (-1 < index) goto LAB_001239eb;
LAB_00123a8a:
    pQVar6 = this->d->sqlResult;
  }
  pp_Var4 = pQVar6->_vptr_QSqlResult;
  uVar5 = 0xffffffff;
LAB_00123abb:
  (*pp_Var4[3])(pQVar6,uVar5);
  return false;
}

Assistant:

bool QSqlQuery::seek(int index, bool relative)
{
    if (!isSelect() || !isActive())
        return false;
    int actualIdx;
    if (!relative) { // arbitrary seek
        if (index < 0) {
            d->sqlResult->setAt(QSql::BeforeFirstRow);
            return false;
        }
        actualIdx = index;
    } else {
        switch (at()) { // relative seek
        case QSql::BeforeFirstRow:
            if (index > 0)
                actualIdx = index - 1;
            else {
                return false;
            }
            break;
        case QSql::AfterLastRow:
            if (index < 0) {
                d->sqlResult->fetchLast();
                actualIdx = at() + index + 1;
            } else {
                return false;
            }
            break;
        default:
            if ((at() + index) < 0) {
                d->sqlResult->setAt(QSql::BeforeFirstRow);
                return false;
            }
            actualIdx = at() + index;
            break;
        }
    }
    // let drivers optimize
    if (isForwardOnly() && actualIdx < at()) {
        qCWarning(lcSqlQuery, "QSqlQuery::seek: cannot seek backwards in a forward only query");
        return false;
    }
    if (actualIdx == (at() + 1) && at() != QSql::BeforeFirstRow) {
        if (!d->sqlResult->fetchNext()) {
            d->sqlResult->setAt(QSql::AfterLastRow);
            return false;
        }
        return true;
    }
    if (actualIdx == (at() - 1)) {
        if (!d->sqlResult->fetchPrevious()) {
            d->sqlResult->setAt(QSql::BeforeFirstRow);
            return false;
        }
        return true;
    }
    if (!d->sqlResult->fetch(actualIdx)) {
        d->sqlResult->setAt(QSql::AfterLastRow);
        return false;
    }
    return true;
}